

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTest::DeathTest(DeathTest *this)

{
  undefined8 extraout_RAX;
  string local_30;
  
  this->_vptr_DeathTest = (_func_int **)&PTR__DeathTest_00154498;
  UnitTest::GetInstance();
  if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ != (TestInfo *)0x0) {
    return;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"Cannot run a death test outside of a TEST or TEST_F construct","")
  ;
  DeathTestAbort(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::DeathTest() {
  TestInfo* const info = GetUnitTestImpl()->current_test_info();
  if (info == nullptr) {
    DeathTestAbort("Cannot run a death test outside of a TEST or "
                   "TEST_F construct");
  }
}